

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

xmlSaveCtxtPtr xmlSaveToFilename(char *filename,char *encoding,int options)

{
  xmlOutputBufferPtr pxVar1;
  int compression;
  xmlSaveCtxtPtr ret;
  int options_local;
  char *encoding_local;
  char *filename_local;
  
  filename_local = (char *)xmlNewSaveCtxt(encoding,options);
  if ((xmlSaveCtxtPtr)filename_local == (xmlSaveCtxtPtr)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    pxVar1 = xmlOutputBufferCreateFilename(filename,((xmlSaveCtxtPtr)filename_local)->handler,0);
    ((xmlSaveCtxtPtr)filename_local)->buf = pxVar1;
    if (((xmlSaveCtxtPtr)filename_local)->buf == (xmlOutputBufferPtr)0x0) {
      xmlFreeSaveCtxt((xmlSaveCtxtPtr)filename_local);
      filename_local = (char *)0x0;
    }
  }
  return (xmlSaveCtxtPtr)filename_local;
}

Assistant:

xmlSaveCtxtPtr
xmlSaveToFilename(const char *filename, const char *encoding, int options)
{
    xmlSaveCtxtPtr ret;
    int compression = 0; /* TODO handle compression option */

    ret = xmlNewSaveCtxt(encoding, options);
    if (ret == NULL) return(NULL);
    ret->buf = xmlOutputBufferCreateFilename(filename, ret->handler,
                                             compression);
    if (ret->buf == NULL) {
	xmlFreeSaveCtxt(ret);
	return(NULL);
    }
    return(ret);
}